

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O1

Color gui::Style::blendColors(Color *src,Color *dest)

{
  byte bVar1;
  uint uVar2;
  Color local_c;
  
  bVar1 = src->a;
  uVar2 = bVar1 ^ 0xff;
  sf::Color::Color(&local_c,(Uint8)((dest->r * uVar2 + (uint)src->r * (uint)bVar1) / 0xff),
                   (Uint8)((dest->g * uVar2 + (uint)src->g * (uint)bVar1) / 0xff),
                   (Uint8)((dest->b * uVar2 + (uint)src->b * (uint)bVar1) / 0xff),dest->a);
  return local_c;
}

Assistant:

sf::Color Style::blendColors(const sf::Color& src, const sf::Color& dest) {
    return {
        static_cast<uint8_t>((static_cast<int>(src.r) * src.a + static_cast<int>(dest.r) * (255 - src.a)) / 255),
        static_cast<uint8_t>((static_cast<int>(src.g) * src.a + static_cast<int>(dest.g) * (255 - src.a)) / 255),
        static_cast<uint8_t>((static_cast<int>(src.b) * src.a + static_cast<int>(dest.b) * (255 - src.a)) / 255),
        dest.a
    };
}